

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<unsigned_int> *
wasm::WATParser::labelidx<wasm::WATParser::ParseDefsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx,bool inDelegate)

{
  bool bVar1;
  uint *u;
  allocator<char> local_f1;
  string local_f0;
  Err local_d0;
  uint local_ac;
  Err local_a8;
  Err *local_88;
  Err *err;
  MaybeResult<unsigned_int> _val;
  undefined1 local_48 [8];
  MaybeResult<unsigned_int> idx;
  bool inDelegate_local;
  ParseDefsCtx *ctx_local;
  
  idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._39_1_ = inDelegate;
  maybeLabelidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<unsigned_int> *)local_48,ctx,inDelegate)
  ;
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_48);
  if (bVar1) {
    MaybeResult<unsigned_int>::MaybeResult
              ((MaybeResult<unsigned_int> *)&err,(MaybeResult<unsigned_int> *)local_48);
    local_88 = MaybeResult<unsigned_int>::getErr((MaybeResult<unsigned_int> *)&err);
    bVar1 = local_88 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_a8,local_88);
      Result<unsigned_int>::Result(__return_storage_ptr__,&local_a8);
      wasm::Err::~Err(&local_a8);
    }
    local_ac = (uint)bVar1;
    MaybeResult<unsigned_int>::~MaybeResult((MaybeResult<unsigned_int> *)&err);
    if (local_ac == 0) {
      u = MaybeResult<unsigned_int>::operator*((MaybeResult<unsigned_int> *)local_48);
      Result<unsigned_int>::Result<unsigned_int&>(__return_storage_ptr__,u);
      local_ac = 1;
    }
  }
  else {
    local_ac = 0;
  }
  MaybeResult<unsigned_int>::~MaybeResult((MaybeResult<unsigned_int> *)local_48);
  if (local_ac == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"expected label index or identifier",&local_f1);
    Lexer::err(&local_d0,&ctx->in,&local_f0);
    Result<unsigned_int>::Result(__return_storage_ptr__,&local_d0);
    wasm::Err::~Err(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LabelIdxT> labelidx(Ctx& ctx, bool inDelegate) {
  if (auto idx = maybeLabelidx(ctx, inDelegate)) {
    CHECK_ERR(idx);
    return *idx;
  }
  return ctx.in.err("expected label index or identifier");
}